

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

int tcu::wrap(WrapMode mode,int c,int size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = c;
  switch(mode) {
  case CLAMP_TO_EDGE:
  case MIRRORED_REPEAT_CL:
    iVar2 = size + -1;
    if (c < size + -1) {
      iVar2 = c;
    }
    iVar1 = 0;
    if (-1 < c) {
      iVar1 = iVar2;
    }
    return iVar1;
  case CLAMP_TO_BORDER:
    if (c < size) {
      size = c;
    }
    iVar2 = -1;
    if (-2 < c) {
      iVar2 = size;
    }
    return iVar2;
  case REPEAT_GL:
  case REPEAT_CL:
    return (c % size >> 0x1f & size) + c % size;
  case MIRRORED_REPEAT_GL:
    goto switchD_0015dac4_caseD_4;
  case MIRRORED_ONCE:
    iVar2 = size;
    if (c < size) {
      iVar2 = c;
    }
    if (c < -size) {
      iVar2 = -size;
    }
switchD_0015dac4_caseD_4:
    iVar2 = iVar2 % (size * 2);
    uVar3 = (iVar2 - size) + (iVar2 >> 0x1f & size * 2);
    return ~((int)uVar3 >> 0x1f ^ uVar3) + size;
  default:
    return 0;
  }
}

Assistant:

static inline int wrap (Sampler::WrapMode mode, int c, int size)
{
	switch (mode)
	{
		case tcu::Sampler::CLAMP_TO_BORDER:
			return deClamp32(c, -1, size);

		case tcu::Sampler::CLAMP_TO_EDGE:
			return deClamp32(c, 0, size-1);

		case tcu::Sampler::REPEAT_GL:
			return imod(c, size);

		case tcu::Sampler::REPEAT_CL:
			return imod(c, size);

		case tcu::Sampler::MIRRORED_ONCE:
			c = deClamp32(c, -size, size);
			// Fall-through

		case tcu::Sampler::MIRRORED_REPEAT_GL:
			return (size - 1) - mirror(imod(c, 2*size) - size);

		case tcu::Sampler::MIRRORED_REPEAT_CL:
			return deClamp32(c, 0, size-1); // \note Actual mirroring done already in unnormalization function.

		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}